

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::MultiVertexArrayObjectTest::deinit(MultiVertexArrayObjectTest *this)

{
  ShaderProgram *pSVar1;
  GLenum err;
  deBool dVar2;
  size_type sVar3;
  reference buffers;
  MultiVertexArrayObjectTest *this_local;
  
  do {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_buffers);
    buffers = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->m_buffers,0);
    glwDeleteBuffers((GLsizei)sVar3,buffers);
    err = glwGetError();
    glu::checkError(err,"glDeleteBuffers((GLsizei)m_buffers.size(), &(m_buffers[0]))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x344);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_buffers);
  pSVar1 = this->m_vaoProgram;
  if (pSVar1 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar1);
    operator_delete(pSVar1,0xd0);
  }
  pSVar1 = this->m_stateProgram;
  if (pSVar1 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar1);
    operator_delete(pSVar1,0xd0);
  }
  if (this->m_indices != (deUint8 *)0x0) {
    operator_delete__(this->m_indices);
  }
  return;
}

Assistant:

void MultiVertexArrayObjectTest::deinit (void)
{
	GLU_CHECK_CALL(glDeleteBuffers((GLsizei)m_buffers.size(), &(m_buffers[0])));
	m_buffers.clear();
	delete m_vaoProgram;
	delete m_stateProgram;
	delete[] m_indices;
}